

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VaryingOutputCountShader::shadePrimitives
          (VaryingOutputCountShader *this,GeometryEmitter *output,int verticesIn,
          PrimitivePacket *packets,int numPackets,int invocationID)

{
  VertexPacket *pVVar1;
  int i;
  int iVar2;
  long lVar3;
  void *pvVar4;
  int iVar5;
  PrimitivePacket *pPVar6;
  float fVar7;
  float fVar8;
  GenericVec4 fragColor;
  Vec4 texColor;
  Vec4 position1;
  Vec4 position0;
  Vec4 colors [4];
  undefined4 local_140;
  undefined4 local_13c;
  undefined4 local_134;
  undefined4 local_130;
  undefined1 local_118 [8];
  undefined4 uStack_110;
  undefined4 uStack_10c;
  float local_fc;
  undefined1 local_f8 [20];
  float fStack_e4;
  undefined1 auStack_e0 [24];
  Vec4 local_c8;
  PrimitivePacket *local_b0;
  long local_a8;
  void *local_a0;
  void *local_98;
  Vec4 *local_90;
  float local_88 [4];
  undefined8 local_78;
  undefined8 uStack_70;
  void *local_68;
  size_t sStack_60;
  void *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  size_t sStack_40;
  
  local_b0 = packets;
  local_78 = (void *)0x3f800000;
  uStack_70 = 0x3f80000000000000;
  local_68 = (void *)0x3f80000000000000;
  sStack_60 = 0x3f80000000000000;
  local_58 = (void *)0x0;
  puStack_50 = &DAT_3f8000003f800000;
  local_48 = &DAT_3f8000003f800000;
  sStack_40 = 0x3f80000000000000;
  if (0 < numPackets) {
    local_a8 = (long)invocationID;
    local_fc = (float)invocationID;
    local_a0 = (void *)(ulong)(uint)numPackets;
    pvVar4 = (void *)0x0;
    do {
      local_98 = pvVar4;
      pVVar1 = local_b0[(long)pvVar4].vertices[0];
      iVar5 = *(int *)&(this->super_ShaderProgram).field_0x154;
      if (iVar5 == 2) {
        iVar5 = invocationID;
        if (this->m_instanced == false) {
          iVar5 = (int)pVVar1->outputs[0].v.fData[0];
        }
        sglr::rc::Texture2D::sample((Texture2D *)local_f8,(float)iVar5 * 0.25 + 0.125,0.5,0.0);
        iVar2 = 0;
        if (0.0 < (float)local_f8._8_4_) {
          iVar2 = this->m_maxEmitCount;
        }
        lVar3 = (long)iVar5;
        iVar5 = iVar2 + 6;
        if ((float)local_f8._0_4_ <= 0.0) {
          iVar5 = iVar2;
        }
        local_13c = *(undefined4 *)(&local_78 + lVar3 * 2);
        local_140 = *(undefined4 *)((long)&local_78 + lVar3 * 0x10 + 4);
        local_130 = *(undefined4 *)(&uStack_70 + lVar3 * 2);
        local_134 = *(undefined4 *)((long)&uStack_70 + lVar3 * 0x10 + 4);
        iVar2 = iVar5 + 10;
        if ((float)local_f8._12_4_ <= 0.0) {
          iVar2 = iVar5;
        }
      }
      else if (iVar5 == 1) {
        iVar5 = invocationID;
        if (this->m_instanced == false) {
          iVar5 = (int)pVVar1->outputs[0].v.fData[0];
        }
        lVar3 = (long)iVar5;
        iVar2 = *(int *)((long)&this->m_emitCount->value + lVar3 * 4);
        local_13c = *(undefined4 *)(&local_78 + lVar3 * 2);
        local_140 = *(undefined4 *)((long)&local_78 + lVar3 * 0x10 + 4);
        local_130 = *(undefined4 *)(&uStack_70 + lVar3 * 2);
        local_134 = *(undefined4 *)((long)&uStack_70 + lVar3 * 0x10 + 4);
      }
      else {
        local_13c = 0;
        local_140 = 0;
        local_130 = 0;
        local_134 = 0;
        iVar2 = 0;
        if (iVar5 == 0) {
          local_f8._0_8_ = *(_func_int ***)&pVVar1->outputs[0].v;
          local_f8._8_8_ = *(undefined8 *)((long)&pVVar1->outputs[0].v + 8);
          lVar3 = 0;
          if (this->m_instanced != false) {
            lVar3 = local_a8;
          }
          iVar2 = (int)*(float *)(local_f8 + lVar3 * 4);
          local_140 = 0;
          local_13c = 0;
          if (9 < iVar2) {
            local_13c = 0x3f800000;
          }
          if (iVar2 < 0xb) {
            local_140 = 0x3f800000;
          }
          local_134 = 0x3f800000;
          local_130 = 0x3f800000;
        }
      }
      if (1 < iVar2) {
        auStack_e0._20_4_ = (undefined4)(iVar2 / 2);
        pPVar6 = local_b0 + (long)pvVar4;
        local_90 = &pVVar1->position;
        iVar5 = 0;
        do {
          fVar7 = (((float)iVar5 + 0.5) / (float)auStack_e0._20_4_) * 3.142;
          if (this->m_instanced == false) {
            local_f8._0_8_ = *(undefined8 *)local_90->m_data;
            local_f8._8_4_ = local_90->m_data[2];
            local_f8._12_4_ = local_90->m_data[3];
          }
          else {
            fVar8 = cosf(local_fc);
            fStack_e4 = sinf(local_fc);
            local_f8._16_4_ = fVar8;
            auStack_e0._0_4_ = CLAMP_TO_EDGE;
            auStack_e0._4_4_ = CLAMP_TO_EDGE;
            local_c8.m_data[0] = 0.0;
            local_c8.m_data[1] = 0.0;
            local_c8.m_data[2] = 0.0;
            local_c8.m_data[3] = 0.0;
            lVar3 = 0;
            do {
              local_c8.m_data[lVar3] = *(float *)(local_f8 + lVar3 * 4 + 0x10) * 0.5;
              lVar3 = lVar3 + 1;
            } while (lVar3 != 4);
            local_f8._0_8_ = (_func_int **)0x0;
            local_f8._8_4_ = 0;
            local_f8._12_4_ = 0;
            lVar3 = 0;
            do {
              *(float *)(local_f8 + lVar3 * 4) =
                   (pVVar1->position).m_data[lVar3] + local_c8.m_data[lVar3];
              lVar3 = lVar3 + 1;
            } while (lVar3 != 4);
          }
          fVar8 = cosf(fVar7);
          local_118._4_4_ = sinf(fVar7);
          local_118._0_4_ = fVar8;
          _uStack_110 = 0;
          local_f8._16_4_ = TYPE_1D;
          fStack_e4._0_1_ = false;
          fStack_e4._1_3_ = 0;
          auStack_e0._0_4_ = CLAMP_TO_EDGE;
          auStack_e0._4_4_ = CLAMP_TO_EDGE;
          lVar3 = 0;
          do {
            *(float *)(local_f8 + lVar3 * 4 + 0x10) = *(float *)(local_118 + lVar3 * 4) * 0.15;
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          local_c8.m_data[0] = 0.0;
          local_c8.m_data[1] = 0.0;
          local_c8.m_data[2] = 0.0;
          local_c8.m_data[3] = 0.0;
          lVar3 = 0;
          do {
            local_c8.m_data[lVar3] =
                 *(float *)(local_f8 + lVar3 * 4) + *(float *)(local_f8 + lVar3 * 4 + 0x10);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          fVar8 = cosf(fVar7);
          fVar7 = sinf(fVar7);
          local_88[0] = fVar8;
          local_88[1] = -fVar7;
          local_88[2] = 0.0;
          local_88[3] = 0.0;
          local_118 = (undefined1  [8])0x0;
          _uStack_110 = 0;
          lVar3 = 0;
          do {
            *(float *)(local_118 + lVar3 * 4) = local_88[lVar3] * 0.15;
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          local_f8._16_4_ = TYPE_1D;
          fStack_e4._0_1_ = false;
          fStack_e4._1_3_ = 0;
          auStack_e0._0_4_ = CLAMP_TO_EDGE;
          auStack_e0._4_4_ = CLAMP_TO_EDGE;
          lVar3 = 0;
          do {
            *(float *)(local_f8 + lVar3 * 4 + 0x10) =
                 *(float *)(local_f8 + lVar3 * 4) + *(float *)(local_118 + lVar3 * 4);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          local_118._4_4_ = local_140;
          local_118._0_4_ = local_13c;
          uStack_10c = local_134;
          uStack_110 = local_130;
          rr::GeometryEmitter::EmitVertex
                    (output,&local_c8,0.0,(GenericVec4 *)local_118,pPVar6->primitiveIDIn);
          rr::GeometryEmitter::EmitVertex
                    (output,(Vec4 *)(local_f8 + 0x10),0.0,(GenericVec4 *)local_118,
                     pPVar6->primitiveIDIn);
          iVar5 = iVar5 + 1;
        } while (iVar5 != iVar2 / 2);
      }
      rr::GeometryEmitter::EndPrimitive(output);
      pvVar4 = (void *)((long)local_98 + 1);
    } while (pvVar4 != local_a0);
  }
  return;
}

Assistant:

void VaryingOutputCountShader::shadePrimitives (rr::GeometryEmitter& output, int verticesIn, const rr::PrimitivePacket* packets, const int numPackets, int invocationID) const
{
	DE_UNREF(verticesIn);

	const tcu::Vec4 red			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 green		= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue		= tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);
	const tcu::Vec4 yellow		= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 colors[4]	= { red, green, blue, yellow };

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const rr::VertexPacket*	vertex		= packets[packetNdx].vertices[0];
		int						emitCount	= 0;
		tcu::Vec4				color		= tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);

		if (m_test == READ_ATTRIBUTE)
		{
			emitCount = (int)vertex->outputs[0].get<float>()[(m_instanced) ? (invocationID) : (0)];
			color = tcu::Vec4((emitCount < 10) ? (0.0f) : (1.0f), (emitCount > 10) ? (0.0f) : (1.0f), 1.0f, 1.0f);
		}
		else if (m_test == READ_UNIFORM)
		{
			const int primitiveNdx = (m_instanced) ? (invocationID) : ((int)vertex->outputs[0].get<float>().x());

			DE_ASSERT(primitiveNdx >= 0);
			DE_ASSERT(primitiveNdx < 4);

			emitCount = m_emitCount.value.i4[primitiveNdx];
			color = colors[primitiveNdx];
		}
		else if (m_test == READ_TEXTURE)
		{
			const int			primitiveNdx	= (m_instanced) ? (invocationID) : ((int)vertex->outputs[0].get<float>().x());
			const tcu::Vec2		texCoord		= tcu::Vec2(1.0f / 8.0f + (float)primitiveNdx / 4.0f, 0.5f);
			const tcu::Vec4		texColor		= m_sampler.sampler.tex2D->sample(texCoord.x(), texCoord.y(), 0.0f);

			DE_ASSERT(primitiveNdx >= 0);
			DE_ASSERT(primitiveNdx < 4);

			color = colors[primitiveNdx];
			emitCount = 0;

			if (texColor.x() > 0.0f)
				emitCount += (EMIT_COUNT_VERTEX_0 == -1) ? (m_maxEmitCount) : (EMIT_COUNT_VERTEX_0);
			if (texColor.y() > 0.0f)
				emitCount += (EMIT_COUNT_VERTEX_1 == -1) ? (m_maxEmitCount) : (EMIT_COUNT_VERTEX_1);
			if (texColor.z() > 0.0f)
				emitCount += (EMIT_COUNT_VERTEX_2 == -1) ? (m_maxEmitCount) : (EMIT_COUNT_VERTEX_2);
			if (texColor.w() > 0.0f)
				emitCount += (EMIT_COUNT_VERTEX_3 == -1) ? (m_maxEmitCount) : (EMIT_COUNT_VERTEX_3);
		}
		else
			DE_ASSERT(DE_FALSE);

		for (int ndx = 0; ndx < (int)emitCount / 2; ++ndx)
		{
			const float		angle			= (float(ndx) + 0.5f) / float(emitCount / 2) * 3.142f;
			const tcu::Vec4 basePosition	= (m_instanced) ?
												(vertex->position + tcu::Vec4(deFloatCos(float(invocationID)), deFloatSin(float(invocationID)), 0.0f, 0.0f) * 0.5f) :
												(vertex->position);
			const tcu::Vec4	position0		= basePosition + tcu::Vec4(deFloatCos(angle),  deFloatSin(angle), 0.0f, 0.0f) * 0.15f;
			const tcu::Vec4	position1		= basePosition + tcu::Vec4(deFloatCos(angle), -deFloatSin(angle), 0.0f, 0.0f) * 0.15f;
			rr::GenericVec4	fragColor;

			fragColor = color;

			output.EmitVertex(position0, 0.0f, &fragColor, packets[packetNdx].primitiveIDIn);
			output.EmitVertex(position1, 0.0f, &fragColor, packets[packetNdx].primitiveIDIn);
		}

		output.EndPrimitive();
	}
}